

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void cpu_io_recompile_mips64el(CPUState *cpu,uintptr_t retaddr)

{
  TCGContext_conflict6 *tcg_ctx;
  void *pvVar1;
  TranslationBlock *tb;
  uint32_t uVar2;
  
  tcg_ctx = cpu->uc->tcg_ctx;
  pvVar1 = cpu->env_ptr;
  tb = tcg_tb_lookup_mips64el(tcg_ctx,retaddr);
  if (tb == (TranslationBlock *)0x0) {
    cpu_abort_mips64el(cpu,"cpu_io_recompile: could not find TB for pc=%p",retaddr);
  }
  cpu_restore_state_from_tb(cpu,tb,retaddr,true);
  uVar2 = 0x8001;
  if (((*(uint *)((long)pvVar1 + 0x3e44) & 0x87f800) != 0) &&
     (*(target_ulong *)((long)pvVar1 + 0x100) != tb->pc)) {
    *(target_ulong *)((long)pvVar1 + 0x100) =
         *(target_ulong *)((long)pvVar1 + 0x100) +
         ((ulong)(*(uint *)((long)pvVar1 + 0x3e44) >> 0xd & 2) | 0xfffffffffffffffc);
    *(short *)(cpu[1].tb_jmp_cache + 0x141) = *(short *)(cpu[1].tb_jmp_cache + 0x141) + 1;
    *(uint *)((long)pvVar1 + 0x3e44) = *(uint *)((long)pvVar1 + 0x3e44) & 0xff7807ff;
    uVar2 = 0x8002;
  }
  cpu->cflags_next_tb = uVar2;
  if ((tb->cflags & 0x10000) != 0) {
    if (tb->orig_tb != (TranslationBlock *)0x0) {
      tb_phys_invalidate_mips64el(tcg_ctx,tb->orig_tb,0xffffffffffffffff);
    }
    tcg_tb_remove_mips64el(tcg_ctx,tb);
  }
  cpu_loop_exit_noexc_mips64el(cpu);
}

Assistant:

void cpu_io_recompile(CPUState *cpu, uintptr_t retaddr)
{
    TCGContext *tcg_ctx = cpu->uc->tcg_ctx;
#if defined(TARGET_MIPS) || defined(TARGET_SH4)
    CPUArchState *env = cpu->env_ptr;
#endif
    TranslationBlock *tb;
    uint32_t n;

    tb = tcg_tb_lookup(tcg_ctx, retaddr);
    if (!tb) {
        cpu_abort(cpu, "cpu_io_recompile: could not find TB for pc=%p",
                  (void *)retaddr);
    }
    cpu_restore_state_from_tb(cpu, tb, retaddr, true);

    /* On MIPS and SH, delay slot instructions can only be restarted if
       they were already the first instruction in the TB.  If this is not
       the first instruction in a TB then re-execute the preceding
       branch.  */
    n = 1;
#if defined(TARGET_MIPS)
    if ((env->hflags & MIPS_HFLAG_BMASK) != 0
        && env->active_tc.PC != tb->pc) {
        env->active_tc.PC -= (env->hflags & MIPS_HFLAG_B16 ? 2 : 4);
        cpu_neg(cpu)->icount_decr.u16.low++;
        env->hflags &= ~MIPS_HFLAG_BMASK;
        n = 2;
    }
#elif defined(TARGET_SH4)
    if ((env->flags & ((DELAY_SLOT | DELAY_SLOT_CONDITIONAL))) != 0
        && env->pc != tb->pc) {
        env->pc -= 2;
        cpu_neg(cpu)->icount_decr.u16.low++;
        env->flags &= ~(DELAY_SLOT | DELAY_SLOT_CONDITIONAL);
        n = 2;
    }
#endif

    /* Generate a new TB executing the I/O insn.  */
    cpu->cflags_next_tb = curr_cflags() | CF_LAST_IO | n;

    if (tb_cflags(tb) & CF_NOCACHE) {
        if (tb->orig_tb) {
            /* Invalidate original TB if this TB was generated in
             * cpu_exec_nocache() */
            tb_phys_invalidate(tcg_ctx, tb->orig_tb, -1);
        }
        tcg_tb_remove(tcg_ctx, tb);
    }

    /* TODO: If env->pc != tb->pc (i.e. the faulting instruction was not
     * the first in the TB) then we end up generating a whole new TB and
     *  repeating the fault, which is horribly inefficient.
     *  Better would be to execute just this insn uncached, or generate a
     *  second new TB.
     */
    cpu_loop_exit_noexc(cpu);
}